

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1f2fe16::Impl::EventHandlers::put
          (EventHandlers *this,TypeInfo *typeinfo,GenericResponseSentHandler *handler)

{
  undefined8 uVar1;
  pair<std::__detail::_Node_iterator<std::pair<const_dap::TypeInfo_*const,_std::function<void_(const_void_*,_const_dap::Error_*)>_>,_false,_false>,_bool>
  pVar2;
  string local_88 [32];
  _Node_iterator_base<std::pair<const_dap::TypeInfo_*const,_std::function<void_(const_void_*,_const_dap::Error_*)>_>,_false>
  local_68;
  byte local_60;
  _Node_iterator_base<std::pair<const_dap::TypeInfo_*const,_std::function<void_(const_void_*,_const_dap::Error_*)>_>,_false>
  local_48;
  byte local_40;
  byte local_31;
  undefined1 local_30 [7];
  bool added;
  unique_lock<std::mutex> lock;
  GenericResponseSentHandler *handler_local;
  TypeInfo *typeinfo_local;
  EventHandlers *this_local;
  
  lock._8_8_ = handler;
  handler_local = (GenericResponseSentHandler *)typeinfo;
  typeinfo_local = (TypeInfo *)this;
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)local_30,&this->responseSentMutex);
  pVar2 = std::
          unordered_map<dap::TypeInfo_const*,std::function<void(void_const*,dap::Error_const*)>,std::hash<dap::TypeInfo_const*>,std::equal_to<dap::TypeInfo_const*>,std::allocator<std::pair<dap::TypeInfo_const*const,std::function<void(void_const*,dap::Error_const*)>>>>
          ::emplace<dap::TypeInfo_const*&,std::function<void(void_const*,dap::Error_const*)>const&>
                    ((unordered_map<dap::TypeInfo_const*,std::function<void(void_const*,dap::Error_const*)>,std::hash<dap::TypeInfo_const*>,std::equal_to<dap::TypeInfo_const*>,std::allocator<std::pair<dap::TypeInfo_const*const,std::function<void(void_const*,dap::Error_const*)>>>>
                      *)&this->responseSentMap,(TypeInfo **)&handler_local,
                     (function<void_(const_void_*,_const_dap::Error_*)> *)lock._8_8_);
  local_68._M_cur =
       (__node_type *)
       pVar2.first.
       super__Node_iterator_base<std::pair<const_dap::TypeInfo_*const,_std::function<void_(const_void_*,_const_dap::Error_*)>_>,_false>
       ._M_cur;
  local_60 = pVar2.second;
  local_31 = local_60 & 1;
  local_48._M_cur = local_68._M_cur;
  local_40 = local_60;
  if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    (**(code **)(*(long *)&(handler_local->super__Function_base)._M_functor + 0x10))(local_88);
    uVar1 = std::__cxx11::string::c_str();
    errorfLocked(this,"Response sent handler for \'%s\' already registered",uVar1);
    std::__cxx11::string::~string(local_88);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_30);
  return;
}

Assistant:

void put(const dap::TypeInfo* typeinfo,
             const GenericResponseSentHandler& handler) {
      std::unique_lock<std::mutex> lock(responseSentMutex);
      auto added = responseSentMap.emplace(typeinfo, handler).second;
      if (!added) {
        errorfLocked("Response sent handler for '%s' already registered",
                     typeinfo->name().c_str());
      }
    }